

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::inputMethodEvent(QGraphicsProxyWidget *this,QInputMethodEvent *event)

{
  QWidget *pQVar1;
  
  pQVar1 = QWidget::focusWidget(*(QWidget **)(*(long *)(this + 0x18) + 0x210));
  if ((pQVar1 != (QWidget *)0x0) && ((pQVar1->data->widget_attributes & 0x4000) != 0)) {
    QCoreApplication::sendEvent(&pQVar1->super_QObject,(QEvent *)event);
    return;
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::inputMethodEvent(QInputMethodEvent *event)
{
    // Forward input method events if the focus widget enables input methods.
    Q_D(const QGraphicsProxyWidget);
    QWidget *focusWidget = d->widget->focusWidget();
    if (focusWidget && focusWidget->testAttribute(Qt::WA_InputMethodEnabled))
        QCoreApplication::sendEvent(focusWidget, event);
}